

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_mvcs(CPUS390XState_conflict *env,uint64_t l,uint64_t a1,uint64_t a2)

{
  char cVar1;
  uintptr_t unaff_retaddr;
  S390Access local_e8;
  S390Access local_c0;
  uint32_t local_94;
  uintptr_t uStack_90;
  int cc;
  uintptr_t ra;
  S390Access desta;
  S390Access srca;
  uint8_t psw_as;
  uint64_t a2_local;
  uint64_t a1_local;
  uint64_t l_local;
  CPUS390XState_conflict *env_local;
  
  cVar1 = (char)(((env->psw).mask & 0xc00000000000) >> 0x2e);
  local_94 = 0;
  uStack_90 = unaff_retaddr;
  if ((((((env->psw).mask & 0x400000000000000) == 0) || ((env->cregs[0] & 0x4000000) == 0)) ||
      (cVar1 == '\x03')) || (cVar1 == '\x01')) {
    s390_program_interrupt(env,0x13,unaff_retaddr);
  }
  a1_local = wrap_length32(env,l);
  if (a1_local < 0x101) {
    if (a1_local == 0) {
      return local_94;
    }
  }
  else {
    a1_local = 0x100;
    local_94 = 3;
  }
  access_prepare(&local_c0,env,a2,(int)a1_local,MMU_DATA_LOAD,0,uStack_90);
  memcpy(&desta.size1,&local_c0,0x28);
  access_prepare(&local_e8,env,a1,(int)a1_local,MMU_DATA_STORE,1,uStack_90);
  memcpy(&ra,&local_e8,0x28);
  access_memmove(env,(S390Access *)&ra,(S390Access *)&desta.size1,uStack_90);
  return local_94;
}

Assistant:

uint32_t HELPER(mvcs)(CPUS390XState *env, uint64_t l, uint64_t a1, uint64_t a2)
{
    const uint8_t psw_as = (env->psw.mask & PSW_MASK_ASC) >> PSW_SHIFT_ASC;
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int cc = 0;

    HELPER_LOG("%s: %16" PRIx64 " %16" PRIx64 " %16" PRIx64 "\n",
               __func__, l, a1, a2);

    if (!(env->psw.mask & PSW_MASK_DAT) || !(env->cregs[0] & CR0_SECONDARY) ||
        psw_as == AS_HOME || psw_as == AS_ACCREG) {
        s390_program_interrupt(env, PGM_SPECIAL_OP, ra);
    }

    l = wrap_length32(env, l);
    if (l > 256) {
        /* max 256 */
        l = 256;
        cc = 3;
    } else if (!l) {
        return cc;
    }

    /* TODO: Access key handling */
    srca = access_prepare(env, a2, l, MMU_DATA_LOAD, MMU_PRIMARY_IDX, ra);
    desta = access_prepare(env, a1, l, MMU_DATA_STORE, MMU_SECONDARY_IDX, ra);
    access_memmove(env, &desta, &srca, ra);
    return cc;
}